

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<long,_long,_long>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<long,_long,_long>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  RESULT_TYPE_conflict2 RVar1;
  RESULT_TYPE_conflict2 RVar2;
  bool bVar3;
  
  RVar1 = MadAccessor<long,_long,_long>::operator()(this->accessor_l,lhs);
  RVar2 = MadAccessor<long,_long,_long>::operator()(this->accessor_r,rhs);
  bVar3 = RVar1 < RVar2;
  if (this->desc != false) {
    bVar3 = RVar2 < RVar1;
  }
  return bVar3;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}